

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBase.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderBase<Diligent::EngineVkImplTraits>::~ShaderBase
          (ShaderBase<Diligent::EngineVkImplTraits> *this)

{
  _Alloc_hider _Var1;
  string msg;
  string local_38;
  
  (this->
  super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>).
  super_ObjectBase<Diligent::IShaderVk>.super_RefCountedObject<Diligent::IShaderVk>.super_IShaderVk.
  super_IShader.super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_00897230;
  AsyncInitializer::GetAsyncTask((AsyncInitializer *)&local_38,&this->m_AsyncInitializer);
  _Var1._M_p = local_38._M_dataplus._M_p;
  RefCntAutoPtr<Diligent::IAsyncTask>::Release((RefCntAutoPtr<Diligent::IAsyncTask> *)&local_38);
  if (_Var1._M_p != (Char *)0x0) {
    FormatString<char[117]>
              (&local_38,
               (char (*) [117])
               "Compile task is still running. This may result in a crash if the task accesses resources owned by the shader object."
              );
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"~ShaderBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBase.hpp"
               ,0x99);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::string::~string((string *)&this->m_CombinedSamplerSuffix);
  std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
  ~unique_ptr(&this->m_AsyncInitializer);
  DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>::
  ~DeviceObjectBase(&this->
                     super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                   );
  return;
}

Assistant:

~ShaderBase()
    {
        VERIFY(!GetCompileTask(), "Compile task is still running. This may result in a crash if the task accesses resources owned by the shader object.");
    }